

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
helics::varMin<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,helics *this,
          vector<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>,_std::allocator<std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_>_>
          *vals)

{
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *pvVar1;
  _Cat _Var2;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *dval;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *__v;
  
  pvVar3 = std::
           get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     (*(variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        **)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pvVar3);
  pvVar1 = *(variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             **)(this + 8);
  for (__v = *(variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
               **)this; __v != pvVar1; __v = __v + 1) {
    pvVar3 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (__v);
    _Var2 = std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                      (pvVar3,__return_storage_ptr__);
    if (_Var2._M_value < '\0') {
      pvVar3 = std::
               get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         (__v);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(__return_storage_ptr__,pvVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

X varMin(const std::vector<defV>& vals)
{
    X dmin = std::get<X>(vals.front());
    for (const auto& dval : vals) {
        if (std::get<X>(dval) < dmin) {
            dmin = std::get<X>(dval);
        }
    }
    return dmin;
}